

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

int __thiscall Cleaner::CleanRule(Cleaner *this,char *rule)

{
  State *pSVar1;
  Rule *pRVar2;
  allocator<char> local_41;
  string local_40;
  Rule *local_20;
  Rule *r;
  char *rule_local;
  Cleaner *this_local;
  
  r = (Rule *)rule;
  rule_local = (char *)this;
  if (rule != (char *)0x0) {
    Reset(this);
    pRVar2 = r;
    pSVar1 = this->state_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,(char *)pRVar2,&local_41)
    ;
    pRVar2 = BindingEnv::LookupRule(&pSVar1->bindings_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    local_20 = pRVar2;
    if (pRVar2 == (Rule *)0x0) {
      Error("unknown rule \'%s\'",r);
      this->status_ = 1;
    }
    else {
      CleanRule(this,pRVar2);
    }
    return this->status_;
  }
  __assert_fail("rule",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean.cc"
                ,0xf0,"int Cleaner::CleanRule(const char *)");
}

Assistant:

int Cleaner::CleanRule(const char* rule) {
  assert(rule);

  Reset();
  const Rule* r = state_->bindings_.LookupRule(rule);
  if (r) {
    CleanRule(r);
  } else {
    Error("unknown rule '%s'", rule);
    status_ = 1;
  }
  return status_;
}